

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_print(feat_t *fcb,mfcc_t ***feat,int32 nfr,FILE *fp)

{
  uint uVar1;
  uint32 *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (nfr != 0) {
    uVar3 = 0;
    do {
      fprintf((FILE *)fp,"%8d:\n",uVar3 & 0xffffffff);
      uVar4 = 0;
      while( true ) {
        uVar1 = fcb->n_sv;
        if (uVar1 == 0) {
          uVar1 = fcb->n_stream;
        }
        if (uVar1 <= uVar4) break;
        fprintf((FILE *)fp,"\t%2d:",uVar4 & 0xffffffff);
        uVar5 = 0;
        while( true ) {
          puVar2 = &fcb->out_dim;
          if (fcb->lda == (mfcc_t ***)0x0) {
            if (fcb->sv_len == (uint32 *)0x0) {
              puVar2 = fcb->stream_len + uVar4;
            }
            else {
              puVar2 = fcb->sv_len + uVar4;
            }
          }
          if (*puVar2 <= uVar5) break;
          fprintf((FILE *)fp," %8.4f",(double)(float)feat[uVar3][uVar4][uVar5]);
          uVar5 = uVar5 + 1;
        }
        fputc(10,(FILE *)fp);
        uVar4 = uVar4 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nfr);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
feat_print(feat_t * fcb, mfcc_t *** feat, int32 nfr, FILE * fp)
{
    uint32 i, j, k;

    for (i = 0; i < nfr; i++) {
        fprintf(fp, "%8d:\n", i);

        for (j = 0; j < feat_dimension1(fcb); j++) {
            fprintf(fp, "\t%2d:", j);

            for (k = 0; k < feat_dimension2(fcb, j); k++)
                fprintf(fp, " %8.4f", MFCC2FLOAT(feat[i][j][k]));
            fprintf(fp, "\n");
        }
    }

    fflush(fp);
}